

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall
UDPPacketWriter::UDPPacketWriter(UDPPacketWriter *this,void **vtt,Socket *socket,int buf_size)

{
  UDPPacketWriter(this,vtt,socket->sockfd,buf_size);
  return;
}

Assistant:

UDPPacketWriter::UDPPacketWriter(Socket &socket, int buf_size) : UDPPacketWriter(socket.sockfd, buf_size) {}